

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall SignedLongLong_Signed_Test::TestBody(SignedLongLong_Signed_Test *this)

{
  ParamType_conflict4 *pPVar1;
  ScopedTrace local_11;
  SignedLongLong_Signed_Test *pSStack_10;
  ScopedTrace gtest_trace_357;
  SignedLongLong_Signed_Test *this_local;
  
  pSStack_10 = this;
  testing::ScopedTrace::ScopedTrace
            (&local_11,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,0x165,"SignedLong");
  pPVar1 = testing::WithParamInterface<long_long>::GetParam();
  anon_unknown.dwarf_131826::check<long_long>(*pPVar1);
  testing::ScopedTrace::~ScopedTrace(&local_11);
  return;
}

Assistant:

TEST_P (SignedLongLong, Signed) {
    SCOPED_TRACE ("SignedLong");
    check (GetParam ());
}